

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead_common.c
# Opt level: O3

void ascon_aead_init(ascon_aead_ctx_t *ctx,uint8_t *key,uint8_t *nonce,uint64_t iv)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  
  uVar6 = bigendian_decode_u64(key);
  ctx->k0 = uVar6;
  uVar6 = bigendian_decode_u64(key + 8);
  ctx->k1 = uVar6;
  (ctx->bufstate).sponge.x0 = iv;
  (ctx->bufstate).sponge.x1 = ctx->k0;
  (ctx->bufstate).sponge.x2 = uVar6;
  uVar6 = bigendian_decode_u64(nonce);
  (ctx->bufstate).sponge.x3 = uVar6;
  uVar6 = bigendian_decode_u64(nonce + 8);
  (ctx->bufstate).sponge.x4 = uVar6;
  ascon_permutation_12((ascon_sponge_t *)ctx);
  uVar1 = *(uint *)((long)&(ctx->bufstate).sponge.x3 + 4);
  uVar6 = (ctx->bufstate).sponge.x4;
  uVar2 = *(uint *)((long)&(ctx->bufstate).sponge.x4 + 4);
  uVar3 = *(uint *)((long)&ctx->k0 + 4);
  uVar5 = ctx->k1;
  uVar4 = *(uint *)((long)&ctx->k1 + 4);
  *(uint *)&(ctx->bufstate).sponge.x3 = (uint)(ctx->bufstate).sponge.x3 ^ (uint)ctx->k0;
  *(uint *)((long)&(ctx->bufstate).sponge.x3 + 4) = uVar1 ^ uVar3;
  *(uint *)&(ctx->bufstate).sponge.x4 = (uint)uVar6 ^ (uint)uVar5;
  *(uint *)((long)&(ctx->bufstate).sponge.x4 + 4) = uVar2 ^ uVar4;
  (ctx->bufstate).buffer_len = '\0';
  return;
}

Assistant:

void
ascon_aead_init(ascon_aead_ctx_t* const ctx,
                const uint8_t* const key,
                const uint8_t* const nonce,
                const uint64_t iv)
{
    // Store the key in the context as it's required in the final step.
    ctx->k0 = bigendian_decode_u64(key);
    ctx->k1 = bigendian_decode_u64(key + sizeof(uint64_t));
    ctx->bufstate.sponge.x0 = iv;
    ctx->bufstate.sponge.x1 = ctx->k0;
    ctx->bufstate.sponge.x2 = ctx->k1;
    ctx->bufstate.sponge.x3 = bigendian_decode_u64(nonce);
    ctx->bufstate.sponge.x4 = bigendian_decode_u64(nonce + sizeof(uint64_t));
    ascon_permutation_12(&ctx->bufstate.sponge);
    ctx->bufstate.sponge.x3 ^= ctx->k0;
    ctx->bufstate.sponge.x4 ^= ctx->k1;
    ctx->bufstate.buffer_len = 0;
}